

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O2

parse_status_t parser_parse_entity(http_parser_t *parser)

{
  membuffer *m;
  size_t *psVar1;
  int iVar2;
  parse_status_t pVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  undefined1 local_40 [16];
  
  if (parser->position != POS_ENTITY) {
    __assert_fail("parser->position == POS_ENTITY",".upnp/src/genlib/net/http/httpparser.c",0x7a1,
                  "parse_status_t parser_parse_entity(http_parser_t *)");
  }
  m = &(parser->msg).msg;
  do {
    switch(parser->ent_position) {
    case 1:
      pVar3 = parser_get_entity_read_method(parser);
      break;
    case 2:
      sVar7 = (parser->msg).amount_discarded;
      sVar4 = parser->entity_start_position;
      uVar6 = ((parser->msg).msg.length - sVar4) + sVar7;
      (parser->msg).entity.length = uVar6;
      uVar5 = (ulong)parser->content_length;
      if (uVar5 <= uVar6) {
        if (uVar5 < uVar6) {
          (parser->msg).msg.buf[uVar5 + (sVar4 - sVar7)] = '\0';
          uVar5 = (ulong)parser->content_length;
          sVar4 = parser->entity_start_position;
        }
        (parser->msg).entity.length = uVar5;
        (parser->msg).entity.buf = (parser->msg).msg.buf + sVar4;
        parser->position = POS_COMPLETE;
        return PARSE_SUCCESS;
      }
      return PARSE_INCOMPLETE;
    case 3:
      sVar7 = (parser->scanner).cursor;
      pVar3 = match(&parser->scanner,"%x%L%c",&parser->chunk_size,local_40);
      if (pVar3 == PARSE_OK) {
        membuffer_delete(m,sVar7,(parser->scanner).cursor - sVar7);
        (parser->scanner).cursor = sVar7;
        iVar2 = 5;
        if (parser->chunk_size == 0) {
          (parser->msg).entity.length =
               (sVar7 - parser->entity_start_position) + (parser->msg).amount_discarded;
          iVar2 = 6;
        }
        parser->ent_position = iVar2;
LAB_0010c78d:
        pVar3 = PARSE_CONTINUE_1;
      }
      else {
        (parser->scanner).cursor = sVar7;
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpparser.c",0x6e8,
                   "CHUNK COULD NOT BE PARSED\n");
      }
      break;
    case 4:
      sVar7 = (parser->msg).msg.length;
      sVar4 = parser->entity_start_position;
      (parser->msg).entity.length = (sVar7 - sVar4) + (parser->msg).amount_discarded;
      (parser->msg).entity.buf = (parser->msg).msg.buf + sVar4;
      (parser->scanner).cursor = sVar7;
      return PARSE_INCOMPLETE_ENTITY;
    case 5:
      sVar7 = (parser->scanner).cursor;
      if ((parser->msg).msg.length - sVar7 < parser->chunk_size) {
        return PARSE_INCOMPLETE;
      }
      sVar7 = parser->chunk_size + sVar7;
      (parser->scanner).cursor = sVar7;
      pVar3 = match(&parser->scanner,"%c");
      if (pVar3 == PARSE_OK) {
        membuffer_delete(m,sVar7,(parser->scanner).cursor - sVar7);
        (parser->scanner).cursor = sVar7;
        psVar1 = &(parser->msg).entity.length;
        *psVar1 = *psVar1 + parser->chunk_size;
        parser->ent_position = 3;
        goto LAB_0010c78d;
      }
      psVar1 = &(parser->scanner).cursor;
      *psVar1 = *psVar1 - parser->chunk_size;
      break;
    case 6:
      sVar7 = (parser->scanner).cursor;
      pVar3 = parser_parse_headers(parser);
      if (pVar3 == PARSE_OK) {
        parser->position = POS_COMPLETE;
        membuffer_delete(m,sVar7,(parser->scanner).cursor - sVar7);
        (parser->scanner).cursor = sVar7;
        (parser->msg).entity.buf = (parser->msg).msg.buf + parser->entity_start_position;
        return PARSE_SUCCESS;
      }
      return pVar3;
    default:
      __assert_fail("0",".upnp/src/genlib/net/http/httpparser.c",0x7bf,
                    "parse_status_t parser_parse_entity(http_parser_t *)");
    }
    if (pVar3 != PARSE_CONTINUE_1) {
      return pVar3;
    }
  } while( true );
}

Assistant:

parse_status_t parser_parse_entity(http_parser_t *parser)
{
	parse_status_t status;

	assert(parser->position == POS_ENTITY);

	do {
		switch (parser->ent_position) {
		case ENTREAD_USING_CLEN:
			status = parser_parse_entity_using_clen(parser);
			break;

		case ENTREAD_USING_CHUNKED:
			status = parser_parse_chunky_entity(parser);
			break;

		case ENTREAD_CHUNKY_BODY:
			status = parser_parse_chunky_body(parser);
			break;

		case ENTREAD_CHUNKY_HEADERS:
			status = parser_parse_chunky_headers(parser);
			break;

		case ENTREAD_UNTIL_CLOSE:
			status = parser_parse_entity_until_close(parser);
			break;

		case ENTREAD_DETERMINE_READ_METHOD:
			status = parser_get_entity_read_method(parser);
			break;

		default:
			status = PARSE_FAILURE;
			assert(0);
		}

	} while (status == (parse_status_t)PARSE_CONTINUE_1);

	return status;
}